

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O3

void __thiscall helics::Endpoint::setDefaultDestination(Endpoint *this,string_view target)

{
  if (((this->defDest)._M_string_length == 0) &&
     ((char)this->fed->_vptr_MessageFederate[-3][(long)&(this->fed->mfManager)._M_t] < '\x02')) {
    Interface::addDestinationTarget(&this->super_Interface,(string_view)target,UNKNOWN);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->defDest,0,(this->defDest)._M_string_length,target._M_str,target._M_len);
  return;
}

Assistant:

void Endpoint::setDefaultDestination(std::string_view target)
{
    if (defDest.empty() && fed->getCurrentMode() < Federate::Modes::EXECUTING) {
        addDestinationTarget(target);
    }
    defDest = target;
}